

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minesweeper.cpp
# Opt level: O1

void __thiscall
MinefieldGeneratorTests::TestExpectedGridIsProduced
          (MinefieldGeneratorTests *this,uint8_t w,uint8_t h,string *input,string *expected)

{
  pointer pcVar1;
  ostream *poVar2;
  stringstream whenDescription;
  function<void()> afStack_288 [16];
  code *local_278;
  MinefieldGeneratorTests *local_268;
  undefined8 uStack_260;
  code *local_258;
  code *pcStack_250;
  undefined1 *local_248 [2];
  undefined1 local_238 [16];
  undefined1 *local_228 [2];
  undefined1 local_218 [16];
  undefined1 local_208 [8];
  _Alloc_hider local_200;
  char local_1f0 [16];
  _Alloc_hider local_1e0;
  char local_1d0 [16];
  MinefieldGeneratorTests *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::string::_M_assign((string *)&this->m_expectedGrid);
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,"generating a field with width ",0x1e);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,(uint)w);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," and height ",0xc);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,(uint)h);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," and input of ",0xe);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,(input->_M_dataplus)._M_p,input->_M_string_length);
  std::__cxx11::stringbuf::str();
  pcVar1 = (input->_M_dataplus)._M_p;
  local_208[0] = w;
  local_208[1] = h;
  local_200._M_p = local_1f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_200,pcVar1,pcVar1 + input->_M_string_length);
  pcVar1 = (expected->_M_dataplus)._M_p;
  local_1e0._M_p = local_1d0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e0,pcVar1,pcVar1 + expected->_M_string_length);
  local_1c0 = this;
  std::function<void()>::
  function<MinefieldGeneratorTests::TestExpectedGridIsProduced(unsigned_char,unsigned_char,std::__cxx11::string,std::__cxx11::string)::_lambda()_1_,void>
            (afStack_288,(anon_class_80_5_0dda5dc8 *)local_208);
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[5])
            (this,local_228,afStack_288);
  if (local_278 != (code *)0x0) {
    (*local_278)(afStack_288,afStack_288,3);
  }
  if (local_1e0._M_p != local_1d0) {
    operator_delete(local_1e0._M_p);
  }
  if (local_200._M_p != local_1f0) {
    operator_delete(local_200._M_p);
  }
  if (local_228[0] != local_218) {
    operator_delete(local_228[0]);
  }
  local_248[0] = local_238;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_248,"the expected result was returned","");
  uStack_260 = 0;
  pcStack_250 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/Minesweeper.cpp:100:44)>
                ::_M_invoke;
  local_258 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Examples/Minesweeper.cpp:100:44)>
              ::_M_manager;
  local_268 = this;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,local_248);
  if (local_258 != (code *)0x0) {
    (*local_258)(&local_268,&local_268,3);
  }
  if (local_248[0] != local_238) {
    operator_delete(local_248[0]);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void TestExpectedGridIsProduced(uint8_t w, uint8_t h, std::string input, std::string expected)
	{
		m_expectedGrid = expected;

		std::stringstream whenDescription;
		whenDescription << "generating a field with width " << (int)w << " and height " << (int)h << " and input of " << input;
		When(whenDescription.str(), [&, w, h, input, expected]() {
			m_expectedGrid = expected;

			minesweeper::MinefieldGenerator generator(w,h);
			m_returnedGrid = generator.GenerateMinefield(input);
		});

		Then("the expected result was returned", [&](){
			AssertThat(m_returnedGrid, ut11::Is::EqualTo(m_expectedGrid));
		});
	}